

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

void Abc_NtkTransferCopy(Abc_Ntk_t *pNtk)

{
  void *pvVar1;
  ulong uVar2;
  long lVar3;
  Vec_Ptr_t *pVVar4;
  ulong uVar5;
  
  pVVar4 = pNtk->vObjs;
  if (0 < pVVar4->nSize) {
    lVar3 = 0;
    do {
      pvVar1 = pVVar4->pArray[lVar3];
      if ((pvVar1 != (void *)0x0) && ((*(uint *)((long)pvVar1 + 0x14) & 0xf) != 6)) {
        uVar5 = *(ulong *)((long)pvVar1 + 0x40);
        if (uVar5 == 0) {
          uVar5 = 0;
        }
        else {
          uVar2 = *(ulong *)((uVar5 & 0xfffffffffffffffe) + 0x40);
          uVar5 = (uint)uVar5 & 1 ^ uVar2;
          if (uVar2 == 0) {
            uVar5 = 0;
          }
        }
        *(ulong *)((long)pvVar1 + 0x40) = uVar5;
      }
      lVar3 = lVar3 + 1;
      pVVar4 = pNtk->vObjs;
    } while (lVar3 < pVVar4->nSize);
  }
  return;
}

Assistant:

void Abc_NtkTransferCopy( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_ObjIsNet(pObj) )
            pObj->pCopy = pObj->pCopy? Abc_ObjCopyCond(pObj->pCopy) : NULL;
}